

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::ClassType::serializeTo(ClassType *this,ASTSerializer *serializer)

{
  string_view name;
  string_view name_00;
  bool bVar1;
  ClassType *in_RSI;
  size_t in_RDI;
  char *unaff_retaddr;
  Type *type;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *__range2;
  Expression *expr;
  Type *base;
  ClassType *in_stack_000001e8;
  ClassType *pCVar2;
  ClassType *in_stack_fffffffffffffef0;
  ClassType *pCVar3;
  ClassType *in_stack_fffffffffffffef8;
  ClassType *in_stack_ffffffffffffff00;
  ClassType *in_stack_ffffffffffffff08;
  __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
  local_c0;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> local_b8;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *local_a8;
  int local_90;
  void *local_88;
  Expression *local_80;
  int local_78;
  void *local_70;
  Type *local_68;
  int local_50;
  void *local_48;
  int local_40;
  void *local_38;
  int local_30;
  void *local_28;
  int local_20;
  Symbol *in_stack_ffffffffffffffe8;
  size_t sVar4;
  
  pCVar2 = in_RSI;
  sVar4 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
             (char *)in_stack_fffffffffffffef8);
  ASTSerializer::write
            ((ASTSerializer *)in_RSI,local_20,in_stack_ffffffffffffffe8,
             (ulong)(*(byte *)(in_RDI + 0x90) & 1));
  pCVar3 = pCVar2;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
             (char *)in_stack_fffffffffffffef8);
  ASTSerializer::write
            ((ASTSerializer *)pCVar2,local_30,local_28,(ulong)(*(byte *)(in_RDI + 0x91) & 1));
  pCVar2 = pCVar3;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
             (char *)in_stack_fffffffffffffef8);
  ASTSerializer::write
            ((ASTSerializer *)pCVar3,local_40,local_38,(ulong)(*(byte *)(in_RDI + 0x92) & 1));
  pCVar3 = pCVar2;
  if (*(long *)(in_RDI + 0xa8) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    ASTSerializer::write((ASTSerializer *)pCVar2,local_50,local_48,*(size_t *)(in_RDI + 0xa8));
    in_stack_ffffffffffffff08 = pCVar2;
  }
  pCVar2 = pCVar3;
  if (*(long *)(in_RDI + 0x80) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)pCVar3,
               (char *)in_stack_fffffffffffffef8);
    name_00._M_str = unaff_retaddr;
    name_00._M_len = sVar4;
    ASTSerializer::writeLink((ASTSerializer *)pCVar2,name_00,in_stack_ffffffffffffffe8);
    in_stack_ffffffffffffff00 = pCVar3;
  }
  local_68 = getBaseClass(in_stack_fffffffffffffef0);
  pCVar3 = pCVar2;
  if (local_68 != (Type *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
               (char *)pCVar2);
    ASTSerializer::write((ASTSerializer *)pCVar2,local_78,local_70,(size_t)local_68);
    in_stack_fffffffffffffef8 = pCVar2;
  }
  local_80 = getBaseConstructorCall(in_stack_000001e8);
  pCVar2 = pCVar3;
  if (local_80 != (Expression *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    ASTSerializer::write((ASTSerializer *)pCVar3,local_90,local_88,(size_t)local_80);
    in_stack_fffffffffffffef0 = pCVar3;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
             (char *)in_stack_fffffffffffffef8);
  name._M_str = (char *)in_RSI;
  name._M_len = (size_t)in_stack_ffffffffffffff08;
  ASTSerializer::startArray((ASTSerializer *)in_stack_ffffffffffffff00,name);
  local_b8 = getDeclaredInterfaces(pCVar2);
  local_a8 = &local_b8;
  local_c0._M_current =
       (Type **)std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::begin
                          ((span<const_slang::ast::Type_*const,_18446744073709551615UL> *)pCVar2);
  std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::Type_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffef8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                        *)pCVar2);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
    ::operator*(&local_c0);
    ASTSerializer::serialize((ASTSerializer *)in_stack_fffffffffffffef0,(Symbol *)pCVar2,false);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
    ::operator++(&local_c0);
  }
  ASTSerializer::endArray((ASTSerializer *)0x6be196);
  return;
}

Assistant:

void ClassType::serializeTo(ASTSerializer& serializer) const {
    serializer.write("isAbstract", isAbstract);
    serializer.write("isInterface", isInterface);
    serializer.write("isFinal", isFinal);
    if (firstForward)
        serializer.write("forward", *firstForward);
    if (genericClass)
        serializer.writeLink("genericClass", *genericClass);
    if (auto base = getBaseClass())
        serializer.write("baseClass", *base);
    if (auto expr = getBaseConstructorCall())
        serializer.write("baseConstructorCall", *expr);

    serializer.startArray("implements");
    for (auto type : getDeclaredInterfaces())
        serializer.serialize(*type);
    serializer.endArray();
}